

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O3

void spvc_msl_shader_interface_var_init(spvc_msl_shader_interface_var *var)

{
  var->location = 0;
  var->format = SPVC_MSL_SHADER_INPUT_FORMAT_OTHER;
  var->builtin = SpvBuiltInMax;
  var->vecsize = 0;
  return;
}

Assistant:

void spvc_msl_shader_interface_var_init(spvc_msl_shader_interface_var *var)
{
#if SPIRV_CROSS_C_API_MSL
	MSLShaderInterfaceVariable var_default;
	var->location = var_default.location;
	var->format = static_cast<spvc_msl_shader_variable_format>(var_default.format);
	var->builtin = static_cast<SpvBuiltIn>(var_default.builtin);
	var->vecsize = var_default.vecsize;
#else
	memset(var, 0, sizeof(*var));
#endif
}